

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

FlagRegistry * google::anon_unknown_1::FlagRegistry::GlobalRegistry(void)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  
  bVar2 = (int)(anonymous_namespace)::FlagRegistry::global_registry_lock_ == 0;
  (anonymous_namespace)::FlagRegistry::global_registry_lock_._0_4_ =
       (int)(anonymous_namespace)::FlagRegistry::global_registry_lock_ + -1;
  if (bVar2) {
    if ((anonymous_namespace)::FlagRegistry::global_registry_ == (FlagRegistry *)0x0) {
      (anonymous_namespace)::FlagRegistry::global_registry_ = (FlagRegistry *)operator_new(0x68);
      p_Var1 = &((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
                super__Rb_tree_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      p_Var1 = &((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
                super__Rb_tree_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      ((anonymous_namespace)::FlagRegistry::global_registry_->lock_).mutex_ = 0;
    }
    (anonymous_namespace)::FlagRegistry::global_registry_lock_._0_4_ = 0;
    return (anonymous_namespace)::FlagRegistry::global_registry_;
  }
  __assert_fail("--mutex_ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/mutex.h"
                ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
}

Assistant:

FlagRegistry* FlagRegistry::GlobalRegistry() {
  MutexLock acquire_lock(&global_registry_lock_);
  if (!global_registry_) {
    global_registry_ = new FlagRegistry;
  }
  return global_registry_;
}